

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void xc_bspline(int i,int p,double u,int nderiv,double *U,double *ders)

{
  int iVar1;
  size_t __n;
  double dVar2;
  ulong uVar3;
  size_t __n_00;
  long lVar4;
  undefined1 *puVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double ND [5];
  double N [8] [8];
  int local_2a8;
  size_t local_278;
  ulong local_270;
  double local_268 [6];
  double local_238 [8];
  undefined1 local_1f8 [456];
  
  __n = (long)nderiv * 8 + 8;
  memset(ders,0,__n);
  dVar15 = U[i];
  if (u < dVar15) {
    return;
  }
  iVar1 = i + p;
  if (U[(long)iVar1 + 1] <= u) {
    return;
  }
  memset(local_238,0,0x200);
  if (-1 < p) {
    uVar3 = 0;
    do {
      dVar16 = 0.0;
      if (U[(long)i + uVar3] <= u) {
        dVar16 = (double)(-(ulong)(u < U[(long)i + uVar3 + 1]) & 0x3ff0000000000000);
      }
      local_238[uVar3] = dVar16;
      uVar3 = uVar3 + 1;
    } while (p + 1 != uVar3);
    if (p != 0) {
      uVar3 = (ulong)(uint)p;
      puVar5 = local_1f8;
      pdVar6 = U + (long)i + 2;
      uVar8 = 1;
      uVar13 = (ulong)(uint)p;
      do {
        dVar16 = local_238[uVar8 * 8 + -8];
        dVar17 = 0.0;
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          dVar17 = (dVar16 * (u - dVar15)) / (U[(long)i + uVar8] - dVar15);
        }
        if (uVar8 <= uVar3) {
          uVar11 = 0;
          do {
            dVar16 = *(double *)(puVar5 + uVar11 * 8 + -0x38);
            if ((dVar16 != 0.0) || (dVar18 = dVar17, dVar2 = 0.0, NAN(dVar16))) {
              dVar16 = dVar16 / (pdVar6[uVar11] - U[(long)i + uVar11 + 1]);
              dVar18 = dVar17 + (pdVar6[uVar11] - u) * dVar16;
              dVar2 = (u - U[(long)i + uVar11 + 1]) * dVar16;
            }
            dVar17 = dVar2;
            *(double *)(puVar5 + uVar11 * 8) = dVar18;
            uVar11 = uVar11 + 1;
          } while (uVar13 != uVar11);
        }
        uVar8 = uVar8 + 1;
        uVar13 = (ulong)((int)uVar13 - 1);
        puVar5 = puVar5 + 0x40;
        pdVar6 = pdVar6 + 1;
      } while (uVar8 != p + 1);
      goto LAB_00ef3f0a;
    }
  }
  uVar3 = (ulong)p;
LAB_00ef3f0a:
  *ders = local_238[uVar3 * 8];
  if (nderiv != 0) {
    if (nderiv < p) {
      p = nderiv;
    }
    if (0 < p) {
      local_2a8 = (int)uVar3;
      lVar12 = (ulong)(uint)(i + local_2a8) << 0x20;
      uVar13 = 2;
      iVar14 = -1;
      uVar8 = 1;
      local_270 = 0;
      do {
        lVar4 = local_270 * -8;
        local_278 = local_270 * 8 + 0x10;
        __n_00 = 0;
        if (local_278 <= __n) {
          __n_00 = __n - local_278;
        }
        memset(local_238 + (local_270 - 4),0,__n_00);
        memcpy(local_268,&local_278 + lVar4 + uVar3 * 8,local_278);
        uVar11 = 1;
        uVar7 = uVar8 & 0xffffffff;
        lVar4 = lVar12;
        do {
          dVar15 = 0.0;
          if ((local_268[0] != 0.0) || (NAN(local_268[0]))) {
            dVar15 = local_268[0] / (U[(long)(iVar1 + iVar14) + uVar11] - U[i]);
          }
          if (uVar11 <= uVar8) {
            uVar10 = 0;
            lVar9 = lVar4;
            do {
              dVar16 = local_268[uVar10 + 1];
              if ((dVar16 != 0.0) || (dVar17 = dVar15, dVar18 = 0.0, NAN(dVar16))) {
                dVar18 = dVar16 / (*(double *)((long)U + (lVar9 >> 0x1d) + 8) -
                                  U[(long)i + uVar10 + 1]);
                dVar17 = dVar15 - dVar18;
              }
              dVar15 = dVar18;
              local_268[uVar10] = dVar17 * (double)(local_2a8 + iVar14 + (int)uVar11);
              uVar10 = uVar10 + 1;
              lVar9 = lVar9 + 0x100000000;
            } while (uVar7 != uVar10);
          }
          uVar11 = uVar11 + 1;
          uVar7 = (ulong)((int)uVar7 - 1);
          lVar4 = lVar4 + 0x100000000;
        } while (uVar11 != uVar13);
        ders[uVar8] = local_268[0];
        uVar8 = uVar8 + 1;
        local_270 = local_270 + 1;
        uVar13 = uVar13 + 1;
        iVar14 = iVar14 + -1;
        lVar12 = lVar12 + -0x100000000;
      } while (local_270 != (uint)p);
    }
  }
  return;
}

Assistant:

GPU_FUNCTION void
xc_bspline(int i, int p, double u, int nderiv, const double *U, double *ders) {

  /* Initialize output array */
  libxc_memset(ders, 0, (nderiv+1)*sizeof(double));

  /* Check locality of support */
  if(u < U[i] || u >= U[i+p+1]) {
    return;
  }

  /* Arrays need static sizes for stack allocation */
#define PMAX 8
  assert(p<PMAX);

  /* Array of normalized B splines, use dense storage for simpler code */
  double N[PMAX][PMAX];
  libxc_memset(N, 0, PMAX*PMAX*sizeof(double));

  /* Initialize zeroth-degree functions: piecewise constants */
  for(int j=0; j<=p; j++) {
    N[0][j] = (u >= U[i+j] && u < U[i+j+1]) ? 1.0 : 0.0;
  }

  /* Fill out table of B splines */
  for(int k=1; k<=p; k++) {
    double saved = (N[k-1][0] == 0.0) ? 0.0 : ((u-U[i])*N[k-1][0])/(U[i+k]-U[i]);

    for(int j=0; j<=p-k; j++) {
      double Ul = U[i+j+1];
      double Ur = U[i+j+k+1];
      if(N[k-1][j+1] == 0.0) {
        N[k][j] = saved;
        saved = 0.0;
      } else {
        double temp = N[k-1][j+1] / (Ur-Ul);
        N[k][j] = saved + (Ur-u)*temp;
        saved = (u-Ul)*temp;
      }
    }
  }

  /* Function value */
  ders[0] = N[p][0];
  if(nderiv==0)
    return;

  /* Helper memory */
  assert(nderiv<=4);
  double ND[5]; /* dimension nderiv+1 */
  int maxk = (nderiv < p) ? nderiv : p;

  /* Compute derivatives */
  for(int k=1; k<=maxk; k++) {
    /* Load appropriate column */
    libxc_memset(ND, 0, (nderiv+1)*sizeof(double));
    for(int j=0; j<=k; j++)
      ND[j] = N[p-k][j];

    /* Compute table */
    for(int jj=1; jj<=k; jj++) {
      double saved = (ND[0] == 0.0) ? 0.0 : ND[0]/(U[i+p-k+jj]-U[i]);

      for(int j=0; j<=k-jj; j++) {
        double Ul = U[i+j+1];
        /* the -k term is missing in the book */
        double Ur = U[i+j+p-k+jj+1];
        if(ND[j+1] == 0.0) {
          ND[j] = (p-k+jj)*saved;
          saved = 0.0;
        } else {
          double temp = ND[j+1]/(Ur-Ul);
          ND[j] = (p-k+jj)*(saved-temp);
          saved = temp;
        }
      }
    }
    /* k:th derivative is */
    ders[k] = ND[0];
  }
}